

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  uint uVar3;
  const_reference plVar4;
  ulong uVar5;
  const_reference puVar6;
  ulong *puVar7;
  const_reference puVar8;
  const_reference piVar9;
  undefined4 extraout_var;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar10;
  undefined4 extraout_var_00;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  RepeatedPtrFieldBase *pRVar15;
  int iVar16;
  LogMessage LStack_38;
  
  if (this->is_repeated != true) {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
LAB_00f8ab37:
      ByteSize();
LAB_00f8ab3f:
      ByteSize();
LAB_00f8ab47:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_38);
    }
    uVar3 = number * 8 + 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar14 = (ulong)(iVar2 * 9 + 0x49U >> 6) << (FVar1 == '\n');
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      return sVar14 + 8;
    case '\x02':
    case '\a':
    case '\x0f':
      return sVar14 + 4;
    case '\x03':
    case '\x04':
      uVar5 = (this->field_0).uint64_t_value;
      break;
    case '\x05':
    case '\x0e':
      uVar5 = (ulong)(this->field_0).int32_t_value;
      break;
    case '\b':
      return sVar14 + 1;
    case '\t':
    case '\f':
      uVar5 = *(ulong *)((this->field_0).int64_t_value + 8);
      sVar14 = sVar14 + uVar5;
      goto LAB_00f8a7f2;
    case '\n':
      uVar5 = (**(code **)(*(long *)this->field_0 + 0x18))();
      goto LAB_00f8a8f3;
    case '\v':
      if ((this->field_0xa & 4) == 0) {
        lVar12 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar12 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar3 = (uint)lVar12 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      return sVar14 + lVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6);
    case '\r':
      uVar5 = (ulong)(this->field_0).uint32_t_value;
LAB_00f8a7f2:
      uVar3 = (uint)uVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      goto LAB_00f8a8ea;
    case '\x11':
      uVar3 = (this->field_0).int32_t_value >> 0x1f ^ (this->field_0).int32_t_value * 2 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      goto LAB_00f8a8ea;
    case '\x12':
      uVar5 = (this->field_0).int64_t_value >> 0x3f ^ (this->field_0).int64_t_value * 2;
      break;
    default:
      return sVar14;
    }
    lVar12 = 0x3f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    iVar2 = (int)lVar12;
LAB_00f8a8ea:
    uVar5 = (ulong)(iVar2 * 9 + 0x49U >> 6);
LAB_00f8a8f3:
    return sVar14 + uVar5;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    if ((byte)(FVar1 - 0x13) < 0xee) {
      ByteSize();
      goto LAB_00f8ab37;
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar3 << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar3 << 2;
      break;
    case '\x03':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        puVar7 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar16);
        lVar12 = 0x3f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x04':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        puVar8 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar16);
        lVar12 = 0x3f;
        if ((*puVar8 | 1) != 0) {
          for (; (*puVar8 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x05':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        lVar12 = 0x3f;
        if (((long)*piVar9 | 1U) != 0) {
          for (; ((long)*piVar9 | 1U) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\b':
      uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar3;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x5e4);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_38,(char (*) [37])"Non-primitive types can\'t be packed.");
      goto LAB_00f8ab47;
    case '\r':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        puVar6 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar16);
        iVar2 = 0x1f;
        if ((*puVar6 | 1) != 0) {
          for (; (*puVar6 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar13 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x0e':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        lVar12 = 0x3f;
        if (((long)*piVar9 | 1U) != 0) {
          for (; ((long)*piVar9 | 1U) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x11':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        uVar3 = *piVar9 >> 0x1f ^ *piVar9 * 2 | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar13 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x12':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_00f8a239_default;
      uVar13 = 0;
      do {
        plVar4 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar16);
        uVar5 = *plVar4 >> 0x3f ^ *plVar4 * 2 | 1;
        lVar12 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    default:
switchD_00f8a239_default:
      uVar13 = 0;
    }
    *(uint *)(this->cached_size).int_ = (uint)uVar13;
    if (uVar13 == 0) {
switchD_00f8a2aa_default:
      return 0;
    }
    uVar3 = (uint)uVar13 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar5 = (ulong)(iVar2 * 9 + 0x49U >> 6);
    uVar3 = number * 8 + 3;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar14 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
    goto LAB_00f8a8f3;
  }
  if ((byte)(FVar1 - 0x13) < 0xee) goto LAB_00f8ab3f;
  uVar3 = number * 8 + 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  lVar12 = (ulong)(iVar2 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar12 = lVar12 + 8;
    goto LAB_00f8a7d3;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar12 = lVar12 + 4;
    goto LAB_00f8a7d3;
  case '\x03':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar7 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
        lVar12 = 0x3f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x04':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar8 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar2);
        lVar12 = 0x3f;
        if ((*puVar8 | 1) != 0) {
          for (; (*puVar8 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x05':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        lVar12 = 0x3f;
        if (((long)*piVar9 | 1U) != 0) {
          for (; ((long)*piVar9 | 1U) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\b':
    lVar12 = lVar12 + 1;
LAB_00f8a7d3:
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    break;
  case '\t':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar12 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar11 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (pRVar15,iVar2);
        uVar3 = (uint)pVVar11->_M_string_length | 1;
        iVar16 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + pVVar11->_M_string_length + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\n':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar12 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar10 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                            (pRVar15,iVar2);
        iVar16 = (*pVVar10->_vptr_MessageLite[3])(pVVar10);
        sVar14 = sVar14 + CONCAT44(extraout_var,iVar16);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\v':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar12 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar10 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                            (pRVar15,iVar2);
        uVar3 = (*pVVar10->_vptr_MessageLite[3])(pVVar10);
        iVar16 = 0x1f;
        if ((uVar3 | 1) != 0) {
          for (; (uVar3 | 1) >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + CONCAT44(extraout_var_00,uVar3) + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\f':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar12 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar11 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (pRVar15,iVar2);
        uVar3 = (uint)pVVar11->_M_string_length | 1;
        iVar16 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + pVVar11->_M_string_length + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\r':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar6 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar2);
        iVar16 = 0x1f;
        if ((*puVar6 | 1) != 0) {
          for (; (*puVar6 | 1) >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x0e':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        lVar12 = 0x3f;
        if (((long)*piVar9 | 1U) != 0) {
          for (; ((long)*piVar9 | 1U) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x11':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        uVar3 = *piVar9 >> 0x1f ^ *piVar9 * 2 | 1;
        iVar16 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x12':
    uVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar12 * (ulong)uVar3;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        plVar4 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
        uVar5 = *plVar4 >> 0x3f ^ *plVar4 * 2 | 1;
        lVar12 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar12 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  default:
    goto switchD_00f8a2aa_default;
  }
  return sVar14;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                         \
          ptr.repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += WireFormatLite::k##CAMELCASE##Size *                   \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size.set(ToCachedSize(result));
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
  case WireFormatLite::TYPE_##UPPERCASE:                                  \
    result +=                                                             \
        tag_size * FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) {  \
      result += WireFormatLite::CAMELCASE##Size(                          \
          ptr.repeated_##LOWERCASE##_value->Get(i));                      \
    }                                                                     \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *      \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *ptr.message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        result += WireFormatLite::LengthDelimitedSize(
            is_lazy ? ptr.lazymessage_value->ByteSizeLong()
                    : ptr.message_value->ByteSizeLong());
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}